

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_bool nk_do_toggle(nk_flags *state,nk_command_buffer *out,nk_rect r,nk_bool *active,char *str,
                    int len,nk_toggle_type type,nk_style_toggle *style,nk_input *in,
                    nk_user_font *font)

{
  float fVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined4 in_EAX;
  uint uVar4;
  nk_bool nVar5;
  uint uVar6;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var7;
  nk_image *img;
  nk_style_item *pnVar8;
  nk_style_toggle *pnVar9;
  char *string;
  float fVar10;
  float fVar11;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float fVar12;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  nk_rect r_00;
  nk_rect r_01;
  nk_rect r_02;
  nk_rect r_03;
  nk_rect r_04;
  nk_rect r_05;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect r_06;
  nk_rect rect_01;
  nk_rect b;
  undefined8 local_148;
  float local_128;
  float fStack_124;
  nk_text local_110;
  nk_toggle_type local_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  undefined4 uStack_ec;
  float local_e8;
  float fStack_e4;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  char *local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_e8 = r.x;
  fStack_f4 = r.y;
  auVar15._0_4_ = -(uint)(out == (nk_command_buffer *)0x0);
  auVar15._4_4_ = -(uint)(style == (nk_style_toggle *)0x0);
  auVar15._8_4_ = -(uint)(font == (nk_user_font *)0x0);
  auVar15._12_4_ = -(uint)(active == (nk_bool *)0x0);
  uVar4 = movmskps(in_EAX,auVar15);
  p_Var7 = (_func_void_nk_command_buffer_ptr_nk_handle *)(ulong)uVar4;
  if (uVar4 != 0) goto LAB_00121087;
  local_d8 = font->height;
  fVar1 = style->border;
  local_48 = fVar1 + fVar1;
  fVar13 = (style->touch_padding).x;
  fVar11 = (style->touch_padding).y;
  local_88 = local_e8 - fVar13;
  fStack_84 = fStack_f4 - fVar11;
  fStack_80 = in_XMM0_Dc - 0.0;
  fStack_7c = in_XMM0_Dd - 0.0;
  local_128 = (style->padding).x;
  fStack_124 = (style->padding).y;
  local_c8 = local_128 + local_128;
  fStack_c4 = fStack_124 + fStack_124;
  fStack_c0 = 0.0;
  fStack_bc = 0.0;
  auVar14._0_4_ = local_c8 + local_d8;
  auVar14._4_4_ = fStack_c4 + local_d8;
  auVar14._8_4_ = local_d8 + 0.0;
  auVar14._12_4_ = local_d8 + 0.0;
  auVar3._8_4_ = in_XMM1_Dc;
  auVar3._0_8_ = r._8_8_;
  auVar3._12_4_ = in_XMM1_Dd;
  auVar15 = maxps(auVar14,auVar3);
  local_98 = fVar13 + fVar13 + auVar15._0_4_;
  fStack_74 = auVar15._4_4_;
  fStack_94 = fVar11 + fVar11 + fStack_74;
  fStack_90 = auVar15._8_4_ + 0.0;
  fStack_8c = auVar15._12_4_ + 0.0;
  fStack_e4 = (fStack_74 * 0.5 + fStack_f4) - local_d8 * 0.5;
  local_68 = ZEXT416((uint)local_d8);
  local_b8 = local_e8 + local_d8 + style->spacing;
  local_58._8_4_ = in_XMM0_Dc;
  local_58._0_8_ = r._0_8_;
  local_58._12_4_ = in_XMM0_Dd;
  fVar13 = auVar15._0_4_ + local_e8;
  local_f8 = local_b8;
  if (local_b8 <= fVar13) {
    local_f8 = fVar13;
  }
  uVar4 = *active;
  *state = *state & 2 | 4;
  r_00.y = fStack_84;
  r_00.x = local_88;
  r_00.h = fStack_94;
  r_00.w = local_98;
  local_fc = type;
  fStack_d4 = local_d8;
  fStack_d0 = local_d8;
  fStack_cc = local_d8;
  fStack_b4 = fStack_f4;
  local_a0 = str;
  local_78 = fStack_e4;
  fStack_70 = fStack_74;
  fStack_6c = fStack_74;
  fStack_44 = local_48;
  fStack_40 = local_48;
  fStack_3c = local_48;
  nVar5 = nk_button_behavior(state,r_00,in,NK_BUTTON_DEFAULT);
  if (nVar5 == 0) {
    uVar6 = *state;
    if ((uVar6 & 0x10) == 0) goto LAB_00120c55;
    if ((((in != (nk_input *)0x0) && (fVar13 = (in->mouse).prev.x, local_88 <= fVar13)) &&
        (fVar13 < local_88 + local_98)) &&
       ((fVar11 = (in->mouse).prev.y, fStack_84 <= fVar11 && (fVar11 < fStack_84 + fStack_94))))
    goto LAB_00120c8d;
    uVar6 = uVar6 | 8;
LAB_00120d4c:
    *state = uVar6;
  }
  else {
    *state = 0x22;
    uVar6 = 0x22;
    uVar4 = (uint)(uVar4 == 0);
LAB_00120c55:
    if (in != (nk_input *)0x0) {
      fVar13 = (in->mouse).prev.x;
LAB_00120c8d:
      if (((local_88 <= fVar13) && (fVar13 < local_88 + local_98)) &&
         ((fVar13 = (in->mouse).prev.y, fStack_84 <= fVar13 && (fVar13 < fStack_84 + fStack_94)))) {
        uVar6 = uVar6 | 0x40;
        goto LAB_00120d4c;
      }
    }
  }
  local_128 = local_128 + local_e8;
  fStack_124 = fStack_124 + fStack_e4;
  local_f8 = local_f8 - local_b8;
  *active = uVar4;
  fVar13 = local_c8 + local_48;
  fVar11 = fStack_c4 + fStack_44;
  if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    local_c8 = local_c8 + local_48;
    fStack_c4 = fStack_c4 + fStack_44;
    fStack_c0 = fStack_c0 + fStack_40;
    fStack_bc = fStack_bc + fStack_3c;
    (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
    fVar13 = local_c8;
    fVar11 = fStack_c4;
  }
  fStack_b0 = fStack_b4;
  fStack_f0 = fStack_f4;
  local_128 = local_128 + fVar1;
  fStack_124 = fStack_124 + fVar1;
  fVar13 = local_d8 - fVar13;
  fVar11 = fStack_d4 - fVar11;
  fStack_b4 = local_78;
  fStack_ac = fStack_74;
  fStack_f4 = (float)local_68._0_4_;
  uStack_ec = local_68._4_4_;
  uVar4 = *state;
  iVar2 = *active;
  if (local_fc == NK_TOGGLE_CHECK) {
    if ((uVar4 & 0x10) == 0) {
      if ((uVar4 & 0x20) != 0) {
        local_110.text = style->text_active;
        goto LAB_00120f56;
      }
      pnVar8 = &style->cursor_normal;
      local_110.text = style->text_normal;
      pnVar9 = style;
    }
    else {
      local_110.text = style->text_hover;
LAB_00120f56:
      pnVar9 = (nk_style_toggle *)&style->hover;
      pnVar8 = &style->cursor_hover;
    }
    if ((pnVar9->normal).type == NK_STYLE_ITEM_COLOR) {
      rect.y = fStack_e4;
      rect.x = local_e8;
      rect.h = fStack_d4;
      rect.w = local_d8;
      nk_fill_rect(out,rect,0.0,style->border_color);
      fVar1 = style->border;
      fVar10 = fVar1 + fVar1;
      fVar12 = fVar10;
      if (fVar10 <= (float)local_68._0_4_) {
        fVar12 = (float)local_68._0_4_;
      }
      rect_00.w = fVar12 - fVar10;
      rect_00.y = local_78 + fVar1;
      rect_00.x = (float)local_58._0_4_ + fVar1;
      rect_00.h = rect_00.w;
      nk_fill_rect(out,rect_00,0.0,(pnVar9->normal).data.color);
    }
    else {
      r_05.y = fStack_e4;
      r_05.x = local_e8;
      r_05.h = fStack_d4;
      r_05.w = local_d8;
      nk_draw_image(out,r_05,&(pnVar9->normal).data.image,(nk_color)0xffffffff);
    }
    string = local_a0;
    if (iVar2 != 0) {
      img = (nk_image *)&pnVar8->data;
      if (pnVar8->type == NK_STYLE_ITEM_IMAGE) goto LAB_0012100b;
      rect_01.y = fStack_124;
      rect_01.x = local_128;
      rect_01.w = fVar13;
      rect_01.h = fVar11;
      nk_fill_rect(out,rect_01,0.0,*(nk_color *)img);
    }
  }
  else {
    if ((uVar4 & 0x10) == 0) {
      if ((uVar4 & 0x20) != 0) {
        local_110.text = style->text_active;
        goto LAB_00120e79;
      }
      pnVar8 = &style->cursor_normal;
      local_110.text = style->text_normal;
      pnVar9 = style;
    }
    else {
      local_110.text = style->text_hover;
LAB_00120e79:
      pnVar9 = (nk_style_toggle *)&style->hover;
      pnVar8 = &style->cursor_hover;
    }
    if ((pnVar9->normal).type == NK_STYLE_ITEM_COLOR) {
      r_02.y = fStack_e4;
      r_02.x = local_e8;
      r_02.h = fStack_d4;
      r_02.w = local_d8;
      nk_fill_circle(out,r_02,style->border_color);
      fVar1 = style->border;
      fVar10 = fVar1 + fVar1;
      fVar12 = fVar10;
      if (fVar10 <= (float)local_68._0_4_) {
        fVar12 = (float)local_68._0_4_;
      }
      r_03.w = fVar12 - fVar10;
      r_03.y = local_78 + fVar1;
      r_03.x = (float)local_58._0_4_ + fVar1;
      r_03.h = r_03.w;
      nk_fill_circle(out,r_03,(pnVar9->normal).data.color);
    }
    else {
      r_01.y = fStack_e4;
      r_01.x = local_e8;
      r_01.h = fStack_d4;
      r_01.w = local_d8;
      nk_draw_image(out,r_01,&(pnVar9->normal).data.image,(nk_color)0xffffffff);
    }
    string = local_a0;
    r_04.y = fStack_124;
    r_04.x = local_128;
    if (iVar2 != 0) {
      img = (nk_image *)&pnVar8->data;
      if (pnVar8->type == NK_STYLE_ITEM_IMAGE) {
LAB_0012100b:
        string = local_a0;
        r_06.y = fStack_124;
        r_06.x = local_128;
        r_06.w = fVar13;
        r_06.h = fVar11;
        nk_draw_image(out,r_06,img,(nk_color)0xffffffff);
      }
      else {
        r_04.w = fVar13;
        r_04.h = fVar11;
        nk_fill_circle(out,r_04,*(nk_color *)img);
      }
    }
  }
  local_110.padding.x = 0.0;
  local_110.padding.y = 0.0;
  local_110.background = style->text_background;
  b.y = fStack_b4;
  b.x = local_b8;
  b.h = fStack_f4;
  b.w = local_f8;
  nk_widget_text(out,b,string,len,&local_110,0x11,font);
  p_Var7 = style->draw_end;
  if (p_Var7 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    p_Var7 = (_func_void_nk_command_buffer_ptr_nk_handle *)
             (*p_Var7)(out,(nk_handle)(style->userdata).ptr);
  }
LAB_00121087:
  return (nk_bool)p_Var7;
}

Assistant:

NK_LIB nk_bool
nk_do_toggle(nk_flags *state,
struct nk_command_buffer *out, struct nk_rect r,
nk_bool *active, const char *str, int len, enum nk_toggle_type type,
const struct nk_style_toggle *style, const struct nk_input *in,
const struct nk_user_font *font)
{
int was_active;
struct nk_rect bounds;
struct nk_rect select;
struct nk_rect cursor;
struct nk_rect label;

NK_ASSERT(style);
NK_ASSERT(out);
NK_ASSERT(font);
if (!out || !style || !font || !active)
return 0;

r.w = NK_MAX(r.w, font->height + 2 * style->padding.x);
r.h = NK_MAX(r.h, font->height + 2 * style->padding.y);

/* add additional touch padding for touch screen devices */
bounds.x = r.x - style->touch_padding.x;
bounds.y = r.y - style->touch_padding.y;
bounds.w = r.w + 2 * style->touch_padding.x;
bounds.h = r.h + 2 * style->touch_padding.y;

/* calculate the selector space */
select.w = font->height;
select.h = select.w;
select.y = r.y + r.h/2.0f - select.h/2.0f;
select.x = r.x;

/* calculate the bounds of the cursor inside the selector */
cursor.x = select.x + style->padding.x + style->border;
cursor.y = select.y + style->padding.y + style->border;
cursor.w = select.w - (2 * style->padding.x + 2 * style->border);
cursor.h = select.h - (2 * style->padding.y + 2 * style->border);

/* label behind the selector */
label.x = select.x + select.w + style->spacing;
label.y = select.y;
label.w = NK_MAX(r.x + r.w, label.x) - label.x;
label.h = select.w;

/* update selector */
was_active = *active;
*active = nk_toggle_behavior(in, bounds, state, *active);

/* draw selector */
if (style->draw_begin)
style->draw_begin(out, style->userdata);
if (type == NK_TOGGLE_CHECK) {
nk_draw_checkbox(out, *state, style, *active, &label, &select, &cursor, str, len, font);
} else {
nk_draw_option(out, *state, style, *active, &label, &select, &cursor, str, len, font);
}
if (style->draw_end)
style->draw_end(out, style->userdata);
return (was_active != *active);
}